

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O2

QueryResult * __thiscall
DiskTable::get(QueryResult *__return_storage_ptr__,DiskTable *this,longlong key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  QueryResult *pQVar3;
  _List_node_base *p_Var4;
  reverse_iterator<std::_List_iterator<DiskTableNode>_> __tmp;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  SSTableDataEntry res;
  allocator<char> local_89;
  QueryResult *local_88;
  undefined1 local_80 [32];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _List_node_base *local_40;
  DiskTable *local_38;
  
  p_Var4 = (_List_node_base *)
           (this->diskView).
           super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (_List_node_base *)
             (this->diskView).
             super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = __return_storage_ptr__;
  local_38 = this;
  do {
    pQVar3 = local_88;
    if (p_Var4 == local_40) {
      local_88->success = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88->data,"",(allocator<char> *)local_80);
      return pQVar3;
    }
    p_Var5 = p_Var4;
    if (p_Var4 == (_List_node_base *)
                  (local_38->diskView).
                  super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      p_Var5 = p_Var4->_M_next;
      for (p_Var6 = p_Var4; p_Var6 != p_Var5; p_Var6 = p_Var6->_M_prev) {
        bVar2 = DiskTableNode::mightIn((DiskTableNode *)(p_Var6->_M_prev + 1),key);
        if (bVar2) {
          DiskTableNode::getEntry
                    ((SSTableDataEntry *)local_80,(DiskTableNode *)(p_Var6->_M_prev + 1),key);
          pQVar3 = local_88;
          if (0 < (long)local_80._8_8_) {
            if (local_80[0] == (allocator<char>)0x1) {
              local_88->success = false;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_88->data,"",&local_89);
            }
            else {
              local_88->success = true;
              paVar1 = &(local_88->data).field_2;
              (local_88->data)._M_dataplus._M_p = (pointer)paVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_p == &local_50) {
                paVar1->_M_allocated_capacity =
                     CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]);
                *(undefined8 *)((long)&(local_88->data).field_2 + 8) = local_50._8_8_;
              }
              else {
                (local_88->data)._M_dataplus._M_p = local_60._M_p;
                paVar1->_M_allocated_capacity =
                     CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]);
              }
              (local_88->data)._M_string_length = local_58;
              local_58 = 0;
              local_50._M_local_buf[0] = '\0';
              local_60._M_p = (pointer)&local_50;
            }
            goto LAB_00107523;
          }
          std::__cxx11::string::~string((string *)&local_60);
        }
      }
    }
    else {
      while (p_Var5 = (((_List_base<DiskTableNode,_std::allocator<DiskTableNode>_> *)
                       &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var5 != p_Var4) {
        bVar2 = DiskTableNode::mightIn((DiskTableNode *)(p_Var5 + 1),key);
        if (bVar2) {
          DiskTableNode::getEntry((SSTableDataEntry *)local_80,(DiskTableNode *)(p_Var5 + 1),key);
          pQVar3 = local_88;
          if (0 < (long)local_80._8_8_) {
            if (local_80[0] == (allocator<char>)0x1) {
              local_88->success = false;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_88->data,"",&local_89);
            }
            else {
              local_88->success = true;
              paVar1 = &(local_88->data).field_2;
              (local_88->data)._M_dataplus._M_p = (pointer)paVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_p == &local_50) {
                paVar1->_M_allocated_capacity =
                     CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]);
                *(undefined8 *)((long)&(local_88->data).field_2 + 8) = local_50._8_8_;
              }
              else {
                (local_88->data)._M_dataplus._M_p = local_60._M_p;
                paVar1->_M_allocated_capacity =
                     CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]);
              }
              (local_88->data)._M_string_length = local_58;
              local_58 = 0;
              local_50._M_local_buf[0] = '\0';
              local_60._M_p = (pointer)&local_50;
            }
LAB_00107523:
            std::__cxx11::string::~string((string *)&local_60);
            return pQVar3;
          }
          std::__cxx11::string::~string((string *)&local_60);
        }
      }
    }
    p_Var4 = (_List_node_base *)&p_Var4[1]._M_prev;
  } while( true );
}

Assistant:

DiskTable::QueryResult DiskTable::get(long long int key) {
    auto cur_level = diskView.begin();
    auto level_end = diskView.end();
    for (; cur_level != level_end; cur_level++) {
        if (cur_level == diskView.begin()) {
            // To ensure correctness of result, we should lookup one written to disk later first in level 0 (if there are two sstable already).
            auto cur_node = cur_level->rbegin();
            auto rend = cur_level->rend();
            for (; cur_node != rend; cur_node++) {
                if (cur_node->mightIn(key)) {
                    auto res = cur_node->getEntry(key);
                    if (cur_node->valid(res)) {
                        if (res.delete_flag) {
                            // Delete record must leave in disk.
                            // See also comment in DiskTableNode#valid.
                            return {false, ""};
                        }
                        return {true, std::move(res.value)};
                    }
                }
            }
        } else {
            auto cur_node = cur_level->begin();
            auto end = cur_level->end();
            for (; cur_node != end; cur_node++) {
                if (cur_node->mightIn(key)) {
                    auto res = cur_node->getEntry(key);
                    if (cur_node->valid(res)) {
                        if (res.delete_flag) {
                            return {false, ""};
                        }
                        return {true, std::move(res.value)};
                    }
                }
            }
        }
    }
    return {false, ""};
}